

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O3

void init_attr(int np)

{
  schar *psVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  xchar xVar8;
  bool bVar9;
  bool bVar10;
  
  u.acurr.a._4_2_ = urole.attrbase._4_2_;
  u.acurr.a._0_4_ = urole.attrbase._0_4_;
  lVar7 = -6;
  do {
    cVar2 = urole.attrdist[lVar7];
    u.atemp.a[lVar7] = cVar2;
    *(undefined1 *)((long)(&u.atime + 1) + lVar7) = 0;
    u.atime.a[lVar7] = '\0';
    np = np - cVar2;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0);
  if (0 < np) {
LAB_0014fb9f:
    uVar6 = 0;
    do {
      uVar4 = mt_random();
      lVar7 = 0;
      uVar4 = uVar4 % 100;
      do {
        uVar5 = uVar4 - (int)urole.attrdist[lVar7];
        if (uVar5 == 0 || (int)uVar4 < (int)urole.attrdist[lVar7]) {
          cVar2 = u.acurr.a[lVar7];
          if (((lVar7 != 0) || (u.umonnum == u.umonster)) ||
             (xVar8 = 'v', ((youmonst.data)->mflags2 & 0x4000000) == 0)) {
            xVar8 = urace.attrmax[lVar7];
          }
          if (cVar2 < xVar8) {
            u.acurr.a[lVar7] = cVar2 + '\x01';
            psVar1 = u.amax.a + lVar7;
            *psVar1 = *psVar1 + '\x01';
            bVar9 = np < 2;
            np = np + -1;
            if (bVar9) {
              return;
            }
            goto LAB_0014fb9f;
          }
          bVar9 = 0x62 < uVar6;
          uVar6 = uVar6 + 1;
          if (bVar9) goto LAB_0014fc38;
          break;
        }
        lVar7 = lVar7 + 1;
        uVar4 = uVar5;
      } while (lVar7 != 6);
    } while( true );
  }
LAB_0014fc38:
  if (np < 0) {
    bVar9 = true;
LAB_0014fc4e:
    uVar6 = 0;
    bVar3 = bVar9;
LAB_0014fc54:
    do {
      uVar4 = mt_random();
      lVar7 = 0;
      uVar4 = uVar4 % 100;
      do {
        uVar5 = uVar4 - (int)urole.attrdist[lVar7];
        if (uVar5 == 0 || (int)uVar4 < (int)urole.attrdist[lVar7]) {
          cVar2 = u.acurr.a[lVar7];
          if (urace.attrmin[lVar7] < cVar2) {
            u.acurr.a[lVar7] = cVar2 + -1;
            psVar1 = u.amax.a + lVar7;
            *psVar1 = *psVar1 + -1;
            bVar9 = np < -1;
            np = np + 1;
            if (np == 0) {
              return;
            }
            goto LAB_0014fc4e;
          }
          bVar10 = uVar6 < 99;
          uVar6 = uVar6 + 1;
          bVar3 = true;
          if (!(bool)(bVar10 & bVar9)) {
            return;
          }
          goto LAB_0014fc54;
        }
        lVar7 = lVar7 + 1;
        uVar4 = uVar5;
      } while (lVar7 != 6);
    } while (bVar3);
  }
  return;
}

Assistant:

void init_attr(int np)
{
	int	i, x, tryct;


	for (i = 0; i < A_MAX; i++) {
	    ABASE(i) = AMAX(i) = urole.attrbase[i];
	    ATEMP(i) = ATIME(i) = 0;
	    np -= urole.attrbase[i];
	}

	tryct = 0;
	while (np > 0 && tryct < 100) {

	    x = rn2(100);
	    for (i = 0; (i < A_MAX) && ((x -= urole.attrdist[i]) > 0); i++) ;
	    if (i >= A_MAX) continue; /* impossible */

	    if (ABASE(i) >= ATTRMAX(i)) {

		tryct++;
		continue;
	    }
	    tryct = 0;
	    ABASE(i)++;
	    AMAX(i)++;
	    np--;
	}

	tryct = 0;
	while (np < 0 && tryct < 100) {		/* for redistribution */

	    x = rn2(100);
	    for (i = 0; (i < A_MAX) && ((x -= urole.attrdist[i]) > 0); i++) ;
	    if (i >= A_MAX) continue; /* impossible */

	    if (ABASE(i) <= ATTRMIN(i)) {

		tryct++;
		continue;
	    }
	    tryct = 0;
	    ABASE(i)--;
	    AMAX(i)--;
	    np++;
	}
}